

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O0

void __thiscall
capnp::_::WirePointer::setKindAndTarget
          (WirePointer *this,Kind kind,word *target,SegmentBuilder *segment)

{
  SegmentWordCount SVar1;
  WirePointer *pWVar2;
  word *pwVar3;
  Fault local_58;
  Fault f_3;
  Fault f_2;
  Fault f_1;
  Fault local_30;
  Fault f;
  SegmentBuilder *segment_local;
  word *target_local;
  Kind kind_local;
  WirePointer *this_local;
  
  f.exception = (Exception *)segment;
  pWVar2 = (WirePointer *)SegmentReader::getStartPtr(&segment->super_SegmentReader);
  if (this < pWVar2) {
    kj::_::Debug::Fault::Fault
              (&local_30,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
               ,0xa4,FAILED,
               "reinterpret_cast<uintptr_t>(this) >= reinterpret_cast<uintptr_t>(segment->getStartPtr())"
               ,"");
    kj::_::Debug::Fault::fatal(&local_30);
  }
  pwVar3 = SegmentReader::getStartPtr((SegmentReader *)f.exception);
  SVar1 = SegmentReader::getSize((SegmentReader *)f.exception);
  if ((WirePointer *)(pwVar3 + SVar1) <= this) {
    kj::_::Debug::Fault::Fault
              (&f_2,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
               ,0xa6,FAILED,
               "reinterpret_cast<uintptr_t>(this) < reinterpret_cast<uintptr_t>(segment->getStartPtr() + segment->getSize())"
               ,"");
    kj::_::Debug::Fault::fatal(&f_2);
  }
  pwVar3 = SegmentReader::getStartPtr((SegmentReader *)f.exception);
  if (target < pwVar3) {
    kj::_::Debug::Fault::Fault
              (&f_3,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
               ,0xa8,FAILED,
               "reinterpret_cast<uintptr_t>(target) >= reinterpret_cast<uintptr_t>(segment->getStartPtr())"
               ,"");
    kj::_::Debug::Fault::fatal(&f_3);
  }
  pwVar3 = SegmentReader::getStartPtr((SegmentReader *)f.exception);
  SVar1 = SegmentReader::getSize((SegmentReader *)f.exception);
  if (target <= pwVar3 + SVar1) {
    DirectWireValue<unsigned_int>::set
              (&this->offsetAndKind,((int)((long)target - (long)this >> 3) + -1) * 4 | kind);
    return;
  }
  kj::_::Debug::Fault::Fault
            (&local_58,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
             ,0xaa,FAILED,
             "reinterpret_cast<uintptr_t>(target) <= reinterpret_cast<uintptr_t>(segment->getStartPtr() + segment->getSize())"
             ,"");
  kj::_::Debug::Fault::fatal(&local_58);
}

Assistant:

KJ_ALWAYS_INLINE(void setKindAndTarget(Kind kind, word* target, SegmentBuilder* segment)) {
    // Check that the target is really in the same segment, otherwise subtracting pointers is
    // undefined behavior.  As it turns out, it's undefined behavior that actually produces
    // unexpected results in a real-world situation that actually happened:  At one time,
    // OrphanBuilder's "tag" (a WirePointer) was allowed to be initialized as if it lived in
    // a particular segment when in fact it does not.  On 32-bit systems, where words might
    // only be 32-bit aligned, it's possible that the difference between `this` and `target` is
    // not a whole number of words.  But clang optimizes:
    //     (target - (word*)this - 1) << 2
    // to:
    //     (((ptrdiff_t)target - (ptrdiff_t)this - 8) >> 1)
    // So now when the pointers are not aligned the same, we can end up corrupting the bottom
    // two bits, where `kind` is stored.  For example, this turns a struct into a far pointer.
    // Ouch!
    KJ_DREQUIRE(reinterpret_cast<uintptr_t>(this) >=
                reinterpret_cast<uintptr_t>(segment->getStartPtr()));
    KJ_DREQUIRE(reinterpret_cast<uintptr_t>(this) <
                reinterpret_cast<uintptr_t>(segment->getStartPtr() + segment->getSize()));
    KJ_DREQUIRE(reinterpret_cast<uintptr_t>(target) >=
                reinterpret_cast<uintptr_t>(segment->getStartPtr()));
    KJ_DREQUIRE(reinterpret_cast<uintptr_t>(target) <=
                reinterpret_cast<uintptr_t>(segment->getStartPtr() + segment->getSize()));
    offsetAndKind.set((static_cast<uint32_t>(target - reinterpret_cast<word*>(this) - 1) << 2) | kind);
  }